

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::gridMesh(Mesh *__return_storage_ptr__,float _width,float _height,int _columns,int _rows
                     ,float _y)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar7;
  undefined4 in_XMM2_Db;
  vec3 local_128;
  vec3 local_118;
  int local_10c;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_108;
  undefined4 uStack_104;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_f8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_e8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Mesh local_d8;
  
  local_10c = _columns;
  local_108.y = _y;
  uStack_104 = in_XMM2_Db;
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = LINES;
  fVar5 = _width * 0.5;
  fVar6 = _height * 0.5;
  if (_rows != 0) {
    local_e8.x = fVar5 - fVar5 * 0.0;
    aStack_f4.y = local_108.y * local_108.y + (1.0 - local_108.y) * local_108.y;
    uStack_e0 = 0;
    uStack_dc = uStack_104;
    local_f8.x = fVar5 * 0.0 - fVar5;
    uStack_f0 = 0;
    uStack_ec = uStack_104;
    iVar1 = 0;
    aStack_e4.y = aStack_f4.y;
    do {
      fVar3 = (float)iVar1 / ((float)_rows + -1.0);
      local_128.field_2.z = (1.0 - fVar3) * fVar6 - fVar3 * fVar6;
      local_118.field_1.y = aStack_e4.y;
      local_118.field_0.x = local_e8.x;
      local_128.field_1.y = aStack_f4.y;
      local_128.field_0.x = local_f8.x;
      local_118.field_2.z = local_128.field_2.z;
      lineMesh(&local_d8,&local_118,&local_128);
      Mesh::append(__return_storage_ptr__,&local_d8);
      Mesh::~Mesh(&local_d8);
      iVar1 = iVar1 + 1;
    } while (_rows != iVar1);
  }
  iVar1 = local_10c;
  if (local_10c != 0) {
    fVar3 = (float)local_10c;
    local_108.y = local_108.y * local_108.y + (1.0 - local_108.y) * local_108.y;
    local_f8.x = fVar6 - fVar6 * 0.0;
    iVar2 = 0;
    do {
      fVar4 = (float)iVar2 / (fVar3 + -1.0);
      aVar7.x = (1.0 - fVar4) * fVar5 - fVar4 * fVar5;
      local_118.field_1.y = local_108.y;
      local_118.field_0.x = aVar7.x;
      local_118.field_2.z = local_f8.x;
      local_128.field_1.y = local_108.y;
      local_128.field_0.x = aVar7.x;
      local_128.field_2.z = fVar6 * 0.0 - fVar6;
      lineMesh(&local_d8,&local_118,&local_128);
      Mesh::append(__return_storage_ptr__,&local_d8);
      Mesh::~Mesh(&local_d8);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh gridMesh(float _width, float _height, int _columns, int _rows, float _y) {
    Mesh mesh;
    mesh.setDrawMode(LINES);

    // the origin of the plane is at the center //
    float halfW = _width  * 0.5f;
    float halfH = _height * 0.5f;

    //  . --- A
    //  |     |
    //  B --- .

    glm::vec3 A = glm::vec3(halfW, _y, halfH);
    glm::vec3 B = glm::vec3(-halfW, _y, -halfH);

    // add the vertexes //
    for(int iy = 0; iy != _rows; iy++) {
        float pct = ((float)iy/((float)_rows-1));

        glm::vec3 left = glm::mix(A, B, glm::vec3(0.0, _y, pct));
        glm::vec3 right = glm::mix(A, B, glm::vec3(1.0, _y, pct));

        mesh.append( lineMesh(left, right) );
    }

    for(int ix = 0; ix != _columns; ix++) {
        float pct = ((float)ix/((float)_columns-1));

        glm::vec3 top = glm::mix(A, B, glm::vec3(pct, _y, 0.0));
        glm::vec3 down = glm::mix(A, B, glm::vec3(pct, _y, 1.0));

        mesh.append( lineMesh(top, down) );
    }

    return mesh;
}